

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPrint.c
# Opt level: O1

float Abc_NtkMfsTotalGlitching(Abc_Ntk_t *pNtk)

{
  int iVar1;
  int nRegs;
  void *pvVar2;
  long *plVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Vec_Ptr_t *__ptr;
  Vec_Int_t *p;
  int *piVar7;
  Vec_Int_t *vTruth;
  Gli_Man_t *p_00;
  long lVar8;
  uint *puTruth;
  Vec_Ptr_t *pVVar9;
  long lVar10;
  float fVar11;
  int local_4c;
  
  if (pNtk->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPrint.c"
                  ,0x6bb,"float Abc_NtkMfsTotalGlitching(Abc_Ntk_t *)");
  }
  iVar4 = Abc_NtkGetFaninMax(pNtk);
  if (iVar4 < 7) {
    iVar4 = Abc_NtkGetFaninMax(pNtk);
    if (iVar4 < 7) {
      Abc_NtkToAig(pNtk);
      __ptr = Abc_NtkDfs(pNtk,0);
      p = (Vec_Int_t *)malloc(0x10);
      p->nCap = 0x10;
      p->nSize = 0;
      piVar7 = (int *)malloc(0x40);
      p->pArray = piVar7;
      vTruth = (Vec_Int_t *)malloc(0x10);
      vTruth->nCap = 0x1000;
      vTruth->nSize = 0;
      piVar7 = (int *)malloc(0x4000);
      vTruth->pArray = piVar7;
      iVar4 = pNtk->vCis->nSize;
      iVar1 = __ptr->nSize;
      iVar6 = pNtk->vCos->nSize;
      nRegs = pNtk->nObjCounts[8];
      iVar5 = Abc_NtkGetTotalFanins(pNtk);
      p_00 = Gli_ManAlloc(iVar4 + iVar1 + iVar6,nRegs,iVar5 + pNtk->vCos->nSize);
      pVVar9 = pNtk->vObjs;
      if (0 < pVVar9->nSize) {
        lVar8 = 0;
        do {
          if (pVVar9->pArray[lVar8] != (void *)0x0) {
            *(undefined4 *)((long)pVVar9->pArray[lVar8] + 0x40) = 0xffffffff;
          }
          lVar8 = lVar8 + 1;
          pVVar9 = pNtk->vObjs;
        } while (lVar8 < pVVar9->nSize);
      }
      pVVar9 = pNtk->vCis;
      if (0 < pVVar9->nSize) {
        lVar8 = 0;
        do {
          pvVar2 = pVVar9->pArray[lVar8];
          iVar4 = Gli_ManCreateCi(p_00,*(int *)((long)pvVar2 + 0x2c));
          *(int *)((long)pvVar2 + 0x40) = iVar4;
          lVar8 = lVar8 + 1;
          pVVar9 = pNtk->vCis;
        } while (lVar8 < pVVar9->nSize);
      }
      if (0 < __ptr->nSize) {
        lVar8 = 0;
        do {
          plVar3 = (long *)__ptr->pArray[lVar8];
          p->nSize = 0;
          iVar4 = *(int *)((long)plVar3 + 0x1c);
          if (0 < iVar4) {
            lVar10 = 0;
            do {
              Vec_IntPush(p,*(int *)(*(long *)(*(long *)(*(long *)(*plVar3 + 0x20) + 8) +
                                              (long)*(int *)(plVar3[4] + lVar10 * 4) * 8) + 0x40));
              lVar10 = lVar10 + 1;
              iVar4 = *(int *)((long)plVar3 + 0x1c);
            } while (lVar10 < iVar4);
          }
          puTruth = Hop_ManConvertAigToTruth
                              ((Hop_Man_t *)pNtk->pManFunc,(Hop_Obj_t *)plVar3[7],iVar4,vTruth,0);
          iVar4 = Gli_ManCreateNode(p_00,p,*(int *)((long)plVar3 + 0x2c),puTruth);
          *(int *)(plVar3 + 8) = iVar4;
          lVar8 = lVar8 + 1;
        } while (lVar8 < __ptr->nSize);
      }
      pVVar9 = pNtk->vCos;
      if (0 < pVVar9->nSize) {
        lVar8 = 0;
        do {
          Gli_ManCreateCo(p_00,*(int *)(*(long *)(*(long *)(*(long *)(*pVVar9->pArray[lVar8] + 0x20)
                                                           + 8) +
                                                 (long)**(int **)((long)pVVar9->pArray[lVar8] + 0x20
                                                                 ) * 8) + 0x40));
          lVar8 = lVar8 + 1;
          pVVar9 = pNtk->vCos;
        } while (lVar8 < pVVar9->nSize);
      }
      iVar4 = 0;
      Gli_ManSwitchesAndGlitches(p_00,4000,0.125,0);
      pVVar9 = pNtk->vObjs;
      local_4c = 0;
      if (0 < pVVar9->nSize) {
        lVar8 = 0;
        local_4c = 0;
        iVar4 = 0;
        do {
          pvVar2 = pVVar9->pArray[lVar8];
          if ((pvVar2 != (void *)0x0) && (-1 < *(int *)((long)pvVar2 + 0x40))) {
            iVar1 = *(int *)((long)pvVar2 + 0x2c);
            iVar6 = Gli_ObjNumSwitches(p_00,*(int *)((long)pvVar2 + 0x40));
            local_4c = local_4c + iVar6 * iVar1;
            iVar1 = *(int *)((long)pvVar2 + 0x2c);
            iVar6 = Gli_ObjNumGlitches(p_00,*(int *)((long)pvVar2 + 0x40));
            iVar4 = iVar4 + iVar6 * iVar1;
          }
          lVar8 = lVar8 + 1;
          pVVar9 = pNtk->vObjs;
        } while (lVar8 < pVVar9->nSize);
      }
      Gli_ManStop(p_00);
      if (__ptr->pArray != (void **)0x0) {
        free(__ptr->pArray);
        __ptr->pArray = (void **)0x0;
      }
      if (__ptr != (Vec_Ptr_t *)0x0) {
        free(__ptr);
      }
      if (vTruth->pArray != (int *)0x0) {
        free(vTruth->pArray);
        vTruth->pArray = (int *)0x0;
      }
      free(vTruth);
      if (p->pArray != (int *)0x0) {
        free(p->pArray);
        p->pArray = (int *)0x0;
      }
      free(p);
      if (local_4c == 0) {
        fVar11 = 0.0;
      }
      else {
        fVar11 = ((float)(iVar4 - local_4c) * 100.0) / (float)local_4c;
      }
    }
    else {
      puts(
          "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs."
          );
      fVar11 = -1.0;
    }
    return fVar11;
  }
  __assert_fail("Abc_NtkGetFaninMax(pNtk) <= 6",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcPrint.c"
                ,0x6bc,"float Abc_NtkMfsTotalGlitching(Abc_Ntk_t *)");
}

Assistant:

float Abc_NtkMfsTotalGlitching( Abc_Ntk_t * pNtk )
{
    int nSwitches, nGlitches;
    Gli_Man_t * p;
    Vec_Ptr_t * vNodes;
    Vec_Int_t * vFanins, * vTruth;
    Abc_Obj_t * pObj, * pFanin;
    unsigned * puTruth;
    int i, k;
    assert( Abc_NtkIsLogic(pNtk) );
    assert( Abc_NtkGetFaninMax(pNtk) <= 6 );
    if ( Abc_NtkGetFaninMax(pNtk) > 6 )
    {
        printf( "Abc_NtkMfsTotalGlitching() This procedure works only for mapped networks with LUTs size up to 6 inputs.\n" );
        return -1.0;
    }
    Abc_NtkToAig( pNtk );
    vNodes = Abc_NtkDfs( pNtk, 0 );
    vFanins = Vec_IntAlloc( 6 );
    vTruth = Vec_IntAlloc( 1 << 12 );

    // derive network for glitch computation
    p = Gli_ManAlloc( Vec_PtrSize(vNodes) + Abc_NtkCiNum(pNtk) + Abc_NtkCoNum(pNtk),
        Abc_NtkLatchNum(pNtk), Abc_NtkGetTotalFanins(pNtk) + Abc_NtkCoNum(pNtk) );
    Abc_NtkForEachObj( pNtk, pObj, i )
        pObj->iTemp = -1;
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->iTemp = Gli_ManCreateCi( p, Abc_ObjFanoutNum(pObj) );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        Vec_IntClear( vFanins );
        Abc_ObjForEachFanin( pObj, pFanin, k )
            Vec_IntPush( vFanins, pFanin->iTemp );
        puTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, (Hop_Obj_t *)pObj->pData, Abc_ObjFaninNum(pObj), vTruth, 0 );
        pObj->iTemp = Gli_ManCreateNode( p, vFanins, Abc_ObjFanoutNum(pObj), puTruth );
    }
    Abc_NtkForEachCo( pNtk, pObj, i )
        Gli_ManCreateCo( p, Abc_ObjFanin0(pObj)->iTemp );

    // compute glitching
    Gli_ManSwitchesAndGlitches( p, 4000, 1.0/8.0, 0 );

    // compute the ratio
    nSwitches = nGlitches = 0;
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->iTemp >= 0 )
        {
            nSwitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumSwitches(p, pObj->iTemp);
            nGlitches += Abc_ObjFanoutNum(pObj) * Gli_ObjNumGlitches(p, pObj->iTemp);
        }

    Gli_ManStop( p );
    Vec_PtrFree( vNodes );
    Vec_IntFree( vTruth );
    Vec_IntFree( vFanins );
    return nSwitches ? 100.0*(nGlitches-nSwitches)/nSwitches : 0.0;
}